

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

TakeRowResult __thiscall QFormLayout::takeRow(QFormLayout *this,int row)

{
  QList<QFormLayoutItem_*> *this_00;
  long lVar1;
  pointer ppQVar2;
  QFormLayoutItem **ppQVar3;
  QLayoutItem *pQVar4;
  QLayoutItem *pQVar5;
  long in_FS_OFFSET;
  TakeRowResult TVar6;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if ((uint)row < (uint)(*(ulong *)(lVar1 + 0xd0) >> 1)) {
    this_00 = (QList<QFormLayoutItem_*> *)(lVar1 + 0xc0);
    ppQVar2 = QList<QFormLayoutItem_*>::data(this_00);
    label._0_4_ = SUB84(ppQVar2[row * 2],0);
    label._4_4_ = (undefined4)((ulong)ppQVar2[row * 2] >> 0x20);
    ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                        ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)this_00,row,1);
    field = *ppQVar3;
    QtPrivate::sequential_erase_one<QList<QFormLayoutItem*>,QFormLayoutItem*>
              ((QList<QFormLayoutItem_*> *)(lVar1 + 0xd8),&label);
    QtPrivate::sequential_erase_one<QList<QFormLayoutItem*>,QFormLayoutItem*>
              ((QList<QFormLayoutItem_*> *)(lVar1 + 0xd8),&field);
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::removeRow
              ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)this_00,row);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    pQVar4 = ownershipCleanedItem((QFormLayoutItem *)CONCAT44(label._4_4_,label._0_4_),this);
    pQVar5 = ownershipCleanedItem(field,this);
  }
  else {
    label._0_4_ = 2;
    local_44 = 0;
    label._4_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_40 = "default";
    pQVar5 = (QLayoutItem *)0x0;
    QMessageLogger::warning((char *)&label,"QFormLayout::takeRow: Invalid row %d",(ulong)(uint)row);
    pQVar4 = (QLayoutItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    TVar6.fieldItem = pQVar5;
    TVar6.labelItem = pQVar4;
    return TVar6;
  }
  __stack_chk_fail();
}

Assistant:

QFormLayout::TakeRowResult QFormLayout::takeRow(int row)
{
    Q_D(QFormLayout);

    if (Q_UNLIKELY(!(uint(row) < uint(d->m_matrix.rowCount())))) {
        qWarning("QFormLayout::takeRow: Invalid row %d", row);
        return TakeRowResult();
    }

    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);

    d->m_things.removeOne(label);
    d->m_things.removeOne(field);
    d->m_matrix.removeRow(row);

    invalidate();

    TakeRowResult result;
    result.labelItem = ownershipCleanedItem(label, this);
    result.fieldItem = ownershipCleanedItem(field, this);
    return result;
}